

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O0

Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> * __thiscall
KDIS::UTILS::Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
          (Matrix<float,(unsigned_char)3,(unsigned_char)3> *this,double Value)

{
  ushort local_1c;
  ushort local_1a;
  KUINT16 j;
  KUINT16 i;
  double Value_local;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this_local;
  
  for (local_1a = 0; local_1a < 3; local_1a = local_1a + 1) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      *(float *)(this + (ulong)local_1c * 4 + (ulong)local_1a * 0xc) =
           (float)((double)*(float *)(this + (ulong)local_1c * 4 + (ulong)local_1a * 0xc) * Value);
    }
  }
  return (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)this;
}

Assistant:

Matrix & operator *= ( const T Value )
    {
        for( KUINT16 i = 0; i < cols; ++i )
        {
            for( KUINT16 j = 0; j < rows; ++j )
            {
                Data[i][j] *= Value;
            }
        }

        return *this;
    }